

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O3

UtcTimeStamp * __thiscall
FIX::MessageStoreExceptionWrapper::getCreationTime
          (UtcTimeStamp *__return_storage_ptr__,MessageStoreExceptionWrapper *this,bool *threw,
          IOException *ex)

{
  *threw = false;
  (**(code **)(**(long **)this + 0x50))();
  return __return_storage_ptr__;
}

Assistant:

UtcTimeStamp MessageStoreExceptionWrapper::getCreationTime(bool &threw, IOException &ex) {
  threw = false;
  try {
    return m_pStore->getCreationTime();
  } catch (IOException &e) {
    threw = true;
    ex = e;
    return UtcTimeStamp::now();
  }
}